

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

bool can_see(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  AFFECT_DATA *af;
  AREA_AFFECT_DATA *paf;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  ulong in_stack_ffffffffffffffd0;
  int sn;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  AREA_AFFECT_DATA *local_20;
  
  bVar1 = is_npc(in_stack_ffffffffffffffc8);
  if (bVar1) {
    in_stack_ffffffffffffffd0 = in_RDI->act[0];
    _Var3 = std::pow<int,int>(0,0x5f9eee);
    if ((in_stack_ffffffffffffffd0 & (long)_Var3) != 0) {
      return true;
    }
  }
  sn = (int)(in_stack_ffffffffffffffd0 >> 0x20);
  if (in_RDI == in_RSI) {
    return true;
  }
  bVar1 = is_immortal(in_stack_ffffffffffffffc8);
  if ((!bVar1) && (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), bVar1)) {
    return false;
  }
  bVar1 = is_cabal_guard(in_stack_ffffffffffffffd8);
  if ((bVar1) && (in_RDI->desc == (DESCRIPTOR_DATA *)0x0)) {
    return true;
  }
  iVar2 = get_trust(in_stack_ffffffffffffffc8);
  if (iVar2 < in_RSI->invis_level) {
    return false;
  }
  iVar2 = get_trust(in_stack_ffffffffffffffc8);
  if ((iVar2 < in_RSI->incog_level) && (in_RDI->in_room != in_RSI->in_room)) {
    return false;
  }
  iVar2 = get_trust(in_stack_ffffffffffffffc8);
  if (((iVar2 == 0x33) && (in_RSI->invis_level == 0x33)) &&
     (bVar1 = is_heroimm(in_stack_ffffffffffffffc8), !bVar1)) {
    return false;
  }
  bVar1 = is_npc(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    in_stack_ffffffffffffffc8 = (CHAR_DATA *)in_RDI->act[0];
    _Var3 = std::pow<int,int>(0,0x5fa03e);
    if (((ulong)in_stack_ffffffffffffffc8 & (long)_Var3) != 0) {
      return true;
    }
  }
  bVar1 = is_npc(in_stack_ffffffffffffffc8);
  if ((bVar1) && (bVar1 = is_immortal(in_stack_ffffffffffffffc8), bVar1)) {
    return true;
  }
  bVar1 = is_npc(in_stack_ffffffffffffffc8);
  if ((bVar1) && (0x32 < in_RSI->invis_level)) {
    return false;
  }
  bVar1 = is_npc(in_stack_ffffffffffffffc8);
  if ((!bVar1) && (in_RDI->pcdata->death_status == 8)) {
    return true;
  }
  bVar1 = is_cabal_guard(in_stack_ffffffffffffffd8);
  if (bVar1) {
    return true;
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn);
  if (bVar1) {
    return false;
  }
  bVar1 = is_affected(in_RSI,(int)gsn_ultradiffusion);
  if (bVar1) {
    return false;
  }
  bVar1 = is_affected_area(in_RDI->in_room->area,(int)gsn_whiteout);
  if ((bVar1) && (bVar1 = is_outside(in_stack_ffffffffffffffd8), bVar1)) {
    for (local_20 = in_RDI->in_room->area->affected;
        (local_20 != (AREA_AFFECT_DATA *)0x0 && (local_20->type != gsn_whiteout));
        local_20 = local_20->next) {
    }
    if (local_20->owner != in_RDI) {
      return false;
    }
  }
  bVar1 = is_affected(in_RSI,(int)gsn_watermeld);
  if ((bVar1) && (bVar1 = is_affected(in_RDI,(int)gsn_hydroperception), !bVar1)) {
    return false;
  }
  bVar1 = is_affected(in_RSI,(int)gsn_earthfade);
  if (bVar1) {
    return false;
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn);
  if ((((bVar1) && (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), !bVar1)) &&
      ((bVar1 = is_affected(in_RDI,(int)gsn_hydroperception), !bVar1 ||
       ((((in_RDI->in_room->sector_type != 6 && (in_RDI->in_room->sector_type != 8)) &&
         ((in_RDI->in_room->sector_type == 7 || (in_RSI->in_room->area->sky < 3)))) ||
        (in_RDI->in_room != in_RSI->in_room)))))) &&
     ((((bVar1 = is_affected(in_RDI,(int)gsn_sense_disturbance), !bVar1 ||
        (in_RDI->in_room->sector_type == 8)) || (in_RSI->in_room->sector_type == 8)) &&
      (((bVar1 = is_affected(in_RDI,(int)gsn_sensevibrations), !bVar1 ||
        (in_RSI->in_room->sector_type == 8)) ||
       ((((in_RSI->in_room->sector_type == 9 ||
          ((in_RDI->in_room->sector_type == 8 || (in_RDI->in_room->sector_type == 9)))) ||
         (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), bVar1)) ||
        (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), bVar1)))))))) {
    return false;
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn);
  if ((((((bVar1) && (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), !bVar1)) &&
        (in_RSI->fighting == (CHAR_DATA *)0x0)) &&
       (((bVar1 = is_affected(in_RDI,(int)gsn_darksight), !bVar1 ||
         (in_stack_ffffffffffffffd8 = (CHAR_DATA *)affect_find(in_RDI->affected,(int)gsn_darksight),
         in_stack_ffffffffffffffd8 == (CHAR_DATA *)0x0)) ||
        ((*(int *)&in_stack_ffffffffffffffd8->last_fought != 1 ||
         (bVar1 = room_is_dark((ROOM_INDEX_DATA *)in_stack_ffffffffffffffc8), !bVar1)))))) &&
      (((bVar1 = is_affected(in_RDI,(int)gsn_hydroperception), !bVar1 ||
        (((in_RDI->in_room->sector_type != 6 && (in_RDI->in_room->sector_type != 8)) &&
         ((in_RDI->in_room->sector_type == 7 || (in_RSI->in_room->area->sky < 3)))))) ||
       (in_RDI->in_room != in_RSI->in_room)))) &&
     (((((bVar1 = is_affected(in_RDI,(int)gsn_sensevibrations), !bVar1 ||
         (in_RSI->in_room->sector_type == 8)) || (in_RSI->in_room->sector_type == 9)) ||
       ((in_RDI->in_room->sector_type == 8 || (in_RDI->in_room->sector_type == 9)))) ||
      ((bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), bVar1 ||
       (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), bVar1)))))) {
    return false;
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn);
  if ((bVar1) && (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), !bVar1)) {
    return false;
  }
  bVar1 = is_npc(in_stack_ffffffffffffffc8);
  if (bVar1) {
    return true;
  }
  bVar1 = room_is_dark((ROOM_INDEX_DATA *)in_stack_ffffffffffffffc8);
  if ((bVar1) && (bVar1 = is_affected_by(in_stack_ffffffffffffffd8,sn), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool can_see(CHAR_DATA *ch, CHAR_DATA *victim)
{
	AREA_AFFECT_DATA *paf;
	AFFECT_DATA *af;

	if (is_npc(ch) && IS_SET(ch->act, ACT_DETECT_SPECIAL))
		return true;

	if (ch == victim)
		return true;

	if (!is_immortal(ch) && is_affected_by(victim, AFF_NOSHOW))
		return false;

	if (is_cabal_guard(ch) && !ch->desc)
		return true;

	if (get_trust(ch) < victim->invis_level)
		return false;

	if (get_trust(ch) < victim->incog_level && ch->in_room != victim->in_room)
		return false;

	if (get_trust(ch) == LEVEL_HERO && victim->invis_level == LEVEL_HERO && !is_heroimm(ch))
		return false;

	if ((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT)) || (is_npc(ch) && is_immortal(ch)))
		return true;

	if (is_npc(ch) && victim->invis_level >= LEVEL_HERO)
		return false;

	if (!is_npc(ch) && ch->pcdata->death_status == HAS_DIED)
		return true;

	/* Make sure cabal guardians can always see */
	if (is_cabal_guard(ch))
		return true;

	if (is_affected_by(ch, AFF_BLIND))
		return false;

	if (is_affected(victim, gsn_ultradiffusion))
		return false;

	if (is_affected_area(ch->in_room->area, gsn_whiteout) && is_outside(ch))
	{
		for (paf = ch->in_room->area->affected; paf; paf = paf->next)
		{
			if (paf->type == gsn_whiteout)
				break;
		}

		if (paf->owner != ch)
			return false;
	}

	if (is_affected(victim, gsn_watermeld) && !is_affected(ch, gsn_hydroperception))
		return false;

	if (is_affected(victim, gsn_earthfade))
		return false;

	if (is_affected_by(victim, AFF_INVISIBLE)
		&& !is_affected_by(ch, AFF_DETECT_INVIS)
		&& (!(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room))
		&& !(is_affected(ch, gsn_sense_disturbance)
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_UNDERWATER)
		&& (!(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING))))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_HIDE)
		&& !is_affected_by(ch, AFF_DETECT_HIDDEN)
		&& victim->fighting == nullptr
		&& !(is_affected(ch, gsn_darksight)
			&& (af = affect_find(ch->affected, gsn_darksight))
			&& af->aftype == AFT_SKILL
			&& room_is_dark(victim->in_room))
		&& !(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room)
		&& !(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING)))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_CAMOUFLAGE) && !is_affected_by(ch, AFF_DETECT_CAMO))
		return false;

	if (is_npc(ch))
		return true;

	if (room_is_dark(ch->in_room) && !is_affected_by(ch, AFF_DARK_VISION))
		return false;

	return true;
}